

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Animator_Animation_proc(Am_Object *interp,Am_Time *elapsed_time)

{
  bool bVar1;
  Am_Wrapper *value;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value in_R8;
  float fVar3;
  Am_Value AVar4;
  Am_Value AVar5;
  Am_Value value2;
  Am_Time duration;
  Am_Value value1;
  Am_Value curr_value;
  Am_Object_Method method;
  Am_Path_Function path;
  Am_Timing_Function timing;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Time local_b0;
  Am_Object local_a8;
  Am_Value local_a0;
  Am_Time local_90;
  Am_Value local_88;
  Am_Value local_78;
  Am_Value local_68;
  Am_Value local_58;
  Am_Object_Method local_48;
  Am_Path_Function local_38;
  Am_Timing_Function local_28;
  
  value = Am_Time::operator_cast_to_Am_Wrapper_(elapsed_time);
  Am_Object::Set(interp,0xea,value,0);
  pAVar2 = Am_Object::Get(interp,0x102,0);
  Am_Timing_Function::Am_Timing_Function(&local_28,pAVar2);
  Am_Object::Am_Object(&local_a8,interp);
  Am_Time::Am_Time(&local_b0,elapsed_time);
  fVar3 = (*local_28.Call)((Am_Object_Data *)&local_a8,(Am_Time_Data *)&local_b0);
  Am_Time::~Am_Time(&local_b0);
  Am_Object::~Am_Object(&local_a8);
  local_88.type = 0;
  local_88.value.wrapper_value = (Am_Wrapper *)0x0;
  local_a0.type = 0;
  local_a0.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(interp,0x181,1);
  Am_Value::operator=(&local_88,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x182,1);
  Am_Value::operator=(&local_a0,pAVar2);
  pAVar2 = Am_Object::Get(interp,0x103,0);
  Am_Path_Function::Am_Path_Function(&local_38,pAVar2);
  Am_Object::Am_Object(&local_b8,interp);
  Am_Value::Am_Value(&local_68,&local_88);
  Am_Value::Am_Value(&local_78,&local_a0);
  AVar4.value.wrapper_value = (Am_Wrapper *)&local_68;
  AVar4._0_8_ = &local_b8;
  AVar5.value.wrapper_value = in_R8.wrapper_value;
  AVar5._0_8_ = &local_78;
  (*local_38.Call)((Am_Object_Data *)&local_58,AVar4,AVar5,fVar3);
  Am_Value::~Am_Value(&local_78);
  Am_Value::~Am_Value(&local_68);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::Set(interp,0x169,&local_58,0);
  pAVar2 = Am_Object::Get(interp,0xff,0);
  Am_Time::Am_Time(&local_90,pAVar2);
  if (1.0 <= fVar3) {
    bVar1 = Am_Time::Zero(elapsed_time);
    if (!bVar1) {
      Am_Object::Set(interp,0x169,&local_a0,0);
      pAVar2 = Am_Object::Get(interp,200,0);
      Am_Object_Method::Am_Object_Method(&local_48,pAVar2);
      if (local_48.Call != (Am_Object_Method_Type *)0x0) {
        Am_Object::Am_Object(&local_c0,interp);
        (*local_48.Call)((Am_Object_Data *)&local_c0);
        Am_Object::~Am_Object(&local_c0);
      }
    }
  }
  Am_Object::Am_Object(&local_c8,interp);
  Am_Set_Animated_Slots(&local_c8);
  Am_Object::~Am_Object(&local_c8);
  Am_Time::~Am_Time(&local_90);
  Am_Value::~Am_Value(&local_58);
  Am_Value::~Am_Value(&local_a0);
  Am_Value::~Am_Value(&local_88);
  return;
}

Assistant:

Am_Define_Method(Am_Timer_Method, void, Am_Animator_Animation,
                 (Am_Object interp, const Am_Time &elapsed_time))
{
  interp.Set(Am_ELAPSED_TIME, elapsed_time);

  //
  // INTERPOLATING
  //

  // tau is the current position along the parameterized path,
  // measured as a fraction of the distance along total path.
  // (The path may be abstract;  for instance, if the path is just a list
  // of values, tau = 0.5 would mean halfway down the list.)
  //
  // The timing function maps elapsed_time (true time) into tau (path time).
  Am_Timing_Function timing = interp.Get(Am_TIMING_FUNCTION);
  float tau = timing.Call(interp, elapsed_time);

  // The path function maps tau into an actual position on the path.
  Am_Value value1, value2;
  value1 = interp.Peek(Am_VALUE_1);
  value2 = interp.Peek(Am_VALUE_2);
  Am_Path_Function path = interp.Get(Am_PATH_FUNCTION);
  Am_Value curr_value = path.Call(interp, value1, value2, tau);
  interp.Set(Am_VALUE, curr_value);

  Am_Time duration = interp.Get(Am_CURRENT_DURATION);
  Am_INTER_TRACE_PRINT(interp, "Animator Animation of "
                                   << interp << ", time=" << elapsed_time
                                   << ", duration=" << duration
                                   << ", val=" << interp.Get(Am_VALUE));

  if (tau >= 1.0 && !elapsed_time.Zero()) {
    // call INTERIM_DO to get next segment of path (if any)
    interp.Set(Am_VALUE, value2);

    Am_Object_Method method = interp.Get(Am_INTERIM_DO_METHOD);
    if (method.Valid())
      method.Call(interp);
  }

  Am_Set_Animated_Slots(interp);
}